

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlVoid.cpp
# Opt level: O3

uint64 __thiscall
libebml::EbmlVoid::Overwrite
          (EbmlVoid *this,EbmlElement *EltToVoid,IOCallback *output,bool ComeBackAfterward,
          bool bWithDefault)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  uint64 uVar8;
  
  if (EltToVoid->ElementPosition != 0) {
    iVar1 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
    iVar2 = (*EltToVoid->_vptr_EbmlElement[3])(EltToVoid);
    iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 8);
    iVar3 = CodedSizeLength(EltToVoid->Size,EltToVoid->SizeLength,EltToVoid->bSizeIsFinite);
    if ((ulong)(iVar3 + iVar2 & 0xff) + CONCAT44(extraout_var,iVar1) < 2) {
      uVar8 = 0;
    }
    else {
      iVar3 = (*output->_vptr_IOCallback[5])(output);
      (*output->_vptr_IOCallback[3])(output,EltToVoid->ElementPosition,0);
      iVar1 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
      iVar2 = (*EltToVoid->_vptr_EbmlElement[3])(EltToVoid);
      iVar2 = *(int *)(CONCAT44(extraout_var_03,iVar2) + 8);
      iVar4 = CodedSizeLength(EltToVoid->Size,EltToVoid->SizeLength,EltToVoid->bSizeIsFinite);
      (this->super_EbmlBinary).super_EbmlElement.Size =
           ((ulong)(iVar4 + iVar2 & 0xff) + CONCAT44(extraout_var_02,iVar1)) - 1;
      iVar2 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar1 = CodedSizeLength(CONCAT44(extraout_var_05,iVar1),
                              (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                              (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
      (this->super_EbmlBinary).super_EbmlElement.Size =
           CONCAT44(extraout_var_04,iVar2) - (long)iVar1;
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar2 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
      iVar2 = *(int *)(CONCAT44(extraout_var_07,iVar2) + 8);
      iVar5 = CodedSizeLength((this->super_EbmlBinary).super_EbmlElement.Size,
                              (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                              (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
      iVar6 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
      iVar1 = (*EltToVoid->_vptr_EbmlElement[3])(EltToVoid);
      iVar1 = *(int *)(CONCAT44(extraout_var_09,iVar1) + 8);
      iVar7 = CodedSizeLength(EltToVoid->Size,EltToVoid->SizeLength,EltToVoid->bSizeIsFinite);
      if ((ulong)(iVar5 + iVar2 & 0xff) + CONCAT44(extraout_var_06,iVar4) !=
          (ulong)(iVar7 + iVar1 & 0xff) + CONCAT44(extraout_var_08,iVar6)) {
        iVar2 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        (this->super_EbmlBinary).super_EbmlElement.Size = CONCAT44(extraout_var_10,iVar2) - 1;
        iVar2 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        iVar2 = CodedSizeLength(CONCAT44(extraout_var_11,iVar2),
                                (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                                (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
        (this->super_EbmlBinary).super_EbmlElement.SizeLength = iVar2 + 1;
      }
      iVar2 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      if (CONCAT44(extraout_var_12,iVar2) != 0) {
        EbmlElement::RenderHead((EbmlElement *)this,output,false,bWithDefault,false);
      }
      if (ComeBackAfterward) {
        (*output->_vptr_IOCallback[3])(output,CONCAT44(extraout_var_01,iVar3),0);
      }
      iVar1 = (*EltToVoid->_vptr_EbmlElement[9])(EltToVoid);
      iVar2 = (*EltToVoid->_vptr_EbmlElement[3])(EltToVoid);
      iVar2 = *(int *)(CONCAT44(extraout_var_14,iVar2) + 8);
      iVar3 = CodedSizeLength(EltToVoid->Size,EltToVoid->SizeLength,EltToVoid->bSizeIsFinite);
      uVar8 = (ulong)(iVar3 + iVar2 & 0xff) + CONCAT44(extraout_var_13,iVar1);
    }
    return uVar8;
  }
  return 0;
}

Assistant:

uint64 EbmlVoid::Overwrite(const EbmlElement & EltToVoid, IOCallback & output, bool ComeBackAfterward, bool bWithDefault)
{
  //  EltToVoid.UpdateSize(bWithDefault);
  if (EltToVoid.GetElementPosition() == 0) {
    // this element has never been written
    return 0;
  }
  if (EltToVoid.GetSize() + EltToVoid.HeadSize() <2) {
    // the element can't be written here !
    return 0;
  }

  uint64 CurrentPosition = output.getFilePointer();

  output.setFilePointer(EltToVoid.GetElementPosition());

  // compute the size of the voided data based on the original one
  SetSize(EltToVoid.GetSize() + EltToVoid.HeadSize() - 1); // 1 for the ID
  SetSize(GetSize() - CodedSizeLength(GetSize(), GetSizeLength(), IsFiniteSize()));
  // make sure we handle even the strange cases
  //uint32 A1 = GetSize() + HeadSize();
  //uint32 A2 = EltToVoid.GetSize() + EltToVoid.HeadSize();
  if (GetSize() + HeadSize() != EltToVoid.GetSize() + EltToVoid.HeadSize()) {
    SetSize(GetSize()-1);
    SetSizeLength(CodedSizeLength(GetSize(), GetSizeLength(), IsFiniteSize()) + 1);
  }

  if (GetSize() != 0) {
    RenderHead(output, false, bWithDefault); // the rest of the data is not rewritten
  }

  if (ComeBackAfterward) {
    output.setFilePointer(CurrentPosition);
  }

  return EltToVoid.GetSize() + EltToVoid.HeadSize();
}